

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void removeSpaces(char *str)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  
  iVar3 = 0;
  pcVar2 = str;
  do {
    cVar1 = *pcVar2;
    if (cVar1 != ' ') {
      if (cVar1 == '\0') {
        str[iVar3] = '\0';
        return;
      }
      str[iVar3] = cVar1;
      iVar3 = iVar3 + 1;
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

void removeSpaces(char *str)
{
    // To keep track of non-space character count
    int count = 0;

    // Traverse the given string. If current character
    // is not space, then place it at index 'count++'
    for (int i = 0; str[i]; i++)
        if (str[i] != ' ')
            str[count++] = str[i]; // here count is
                                   // incremented
    str[count] = '\0';
}